

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O0

bool __thiscall FIX::TimeRange::isInRange(TimeRange *this,UtcTimeStamp *dateTime)

{
  int iVar1;
  time_t time;
  undefined1 local_38 [8];
  LocalTimeStamp localDateTime;
  UtcTimeStamp *dateTime_local;
  TimeRange *this_local;
  
  localDateTime.super_DateTime.m_time = (int64_t)dateTime;
  if ((this->m_useLocalTime & 1U) == 0) {
    iVar1 = DateTime::getWeekDay(&dateTime->super_DateTime);
    this_local._7_1_ = isInRange(this,&dateTime->super_DateTime,iVar1);
  }
  else {
    time = DateTime::getTimeT(&dateTime->super_DateTime);
    LocalTimeStamp::LocalTimeStamp((LocalTimeStamp *)local_38,time,0);
    iVar1 = DateTime::getWeekDay((DateTime *)local_38);
    this_local._7_1_ = isInRange(this,(DateTime *)local_38,iVar1);
    LocalTimeStamp::~LocalTimeStamp((LocalTimeStamp *)local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool isInRange(const UtcTimeStamp &dateTime) {
    if (m_useLocalTime) {
      LocalTimeStamp localDateTime(dateTime.getTimeT());
      return isInRange(localDateTime, localDateTime.getWeekDay());
    }

    return isInRange(dateTime, dateTime.getWeekDay());
  }